

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

void __thiscall
embree::Geometry::setIntersectionFilterFunctionN(Geometry *this,RTCFilterFunctionN filter)

{
  exception *this_00;
  undefined8 in_RSI;
  long in_RDI;
  allocator local_61;
  string local_60 [64];
  string *local_20;
  undefined4 local_14;
  exception *local_10;
  
  if ((1 << ((byte)*(undefined4 *)(in_RDI + 0x3c) & 0x1f) & 0x2ef7777fU) == 0) {
    this_00 = (exception *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_60,"filter functions not supported for this geometry",&local_61);
    local_14 = 3;
    local_20 = local_60;
    local_10 = this_00;
    std::exception::exception(this_00);
    *(undefined ***)this_00 = &PTR__rtcore_error_005b1508;
    *(undefined4 *)(this_00 + 8) = local_14;
    std::__cxx11::string::string((string *)(this_00 + 0x10),local_20);
    __cxa_throw(this_00,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  *(undefined8 *)(in_RDI + 0x40) = in_RSI;
  return;
}

Assistant:

void Geometry::setIntersectionFilterFunctionN (RTCFilterFunctionN filter) 
  {
    if (!(getTypeMask() & (MTY_TRIANGLE_MESH | MTY_QUAD_MESH | MTY_CURVES | MTY_SUBDIV_MESH | MTY_USER_GEOMETRY | MTY_GRID_MESH)))
      throw_RTCError(RTC_ERROR_INVALID_OPERATION,"filter functions not supported for this geometry"); 

    intersectionFilterN = filter;
  }